

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lex.c
# Opt level: O0

void step_to_eos(lgx_lex_t *ctx,char end)

{
  int iVar1;
  char end_local;
  lgx_lex_t *ctx_local;
  
  while( true ) {
    while( true ) {
      if ((ctx->source).length <= ctx->offset) {
        return;
      }
      iVar1 = is_next(ctx,'\\');
      if (iVar1 == 0) break;
      ctx->offset = ctx->offset + 1;
    }
    iVar1 = is_next(ctx,end);
    if (iVar1 != 0) break;
    ctx->offset = ctx->offset + 1;
  }
  return;
}

Assistant:

static void step_to_eos(lgx_lex_t* ctx, char end) {
    while (ctx->offset < ctx->source.length) {
        // 处理转义字符 \r \n \t \\ \" \' \0 \xFF
        if (is_next(ctx, '\\')) {
            // 这里只要确保读到正确的字符串结尾，不需要判断转义字符是否合法
            ctx->offset++;
        } else if (is_next(ctx, end)) {
            break;
        } else {
            ctx->offset++;
        }
    }
}